

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH256_update(XXH256_state_t *state_in,void *input,size_t len)

{
  BYTE *pBVar1;
  ulong uVar2;
  XXH_endianess endian_detected;
  size_t len_local;
  void *input_local;
  XXH256_state_t *state_in_local;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  BYTE *limit_1;
  U64 *p64_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  XXH_istate256_t *state_1;
  long local_488;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  BYTE *limit;
  U64 *p64;
  BYTE *bEnd;
  BYTE *p;
  XXH_istate256_t *state;
  
  pBVar1 = (BYTE *)((long)input + len);
  state_in->ll[0] = len + state_in->ll[0];
  if ((uint)state_in->ll[0xe] + len < 0x20) {
    memcpy((void *)((long)state_in->ll + (ulong)(uint)state_in->ll[0xe] + 0x30),input,len);
    *(int *)(state_in->ll + 0xe) = (int)len + (int)state_in->ll[0xe];
  }
  else {
    bEnd = (BYTE *)input;
    if ((int)state_in->ll[0xe] != 0) {
      memcpy((void *)((long)state_in->ll + (ulong)(uint)state_in->ll[0xe] + 0x30),input,
             (ulong)(0x20 - (int)state_in->ll[0xe]));
      state_in->ll[2] = state_in->ll[6] * -0x3d4d51c2d82b14b1 + state_in->ll[2];
      state_in->ll[2] = state_in->ll[2] << 0x1f | (ulong)state_in->ll[2] >> 0x21;
      state_in->ll[2] = state_in->ll[2] * -0x61c8864e7a143579;
      state_in->ll[3] = state_in->ll[7] * -0x3d4d51c2d82b14b1 + state_in->ll[3];
      state_in->ll[3] = state_in->ll[3] << 0x1f | (ulong)state_in->ll[3] >> 0x21;
      state_in->ll[3] = state_in->ll[3] * -0x61c8864e7a143579;
      state_in->ll[4] = state_in->ll[8] * -0x3d4d51c2d82b14b1 + state_in->ll[4];
      state_in->ll[4] = state_in->ll[4] << 0x1f | (ulong)state_in->ll[4] >> 0x21;
      state_in->ll[4] = state_in->ll[4] * -0x61c8864e7a143579;
      state_in->ll[5] = state_in->ll[9] * -0x3d4d51c2d82b14b1 + state_in->ll[5];
      state_in->ll[5] = state_in->ll[5] << 0x1f | (ulong)state_in->ll[5] >> 0x21;
      state_in->ll[5] = state_in->ll[5] * -0x61c8864e7a143579;
      bEnd = (BYTE *)((long)input + (ulong)(0x20 - (int)state_in->ll[0xe]));
      *(undefined4 *)(state_in->ll + 0xe) = 0;
    }
    if (bEnd + 0x20 <= pBVar1) {
      v2 = state_in->ll[2];
      v3 = state_in->ll[3];
      v4 = state_in->ll[4];
      local_488 = state_in->ll[5];
      do {
        uVar2 = *(long *)bEnd * -0x3d4d51c2d82b14b1 + v2;
        v2 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)(bEnd + 8) * -0x3d4d51c2d82b14b1 + v3;
        v3 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)(bEnd + 0x10) * -0x3d4d51c2d82b14b1 + v4;
        v4 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)(bEnd + 0x18) * -0x3d4d51c2d82b14b1 + local_488;
        local_488 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        bEnd = bEnd + 0x20;
      } while (bEnd <= pBVar1 + -0x20);
      state_in->ll[2] = v2;
      state_in->ll[3] = v3;
      state_in->ll[4] = v4;
      state_in->ll[5] = local_488;
    }
    if (bEnd < pBVar1) {
      memcpy(state_in->ll + 6,bEnd,(long)pBVar1 - (long)bEnd);
      *(int *)(state_in->ll + 0xe) = (int)pBVar1 - (int)bEnd;
    }
  }
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH256_update(XXH256_state_t *state_in, const void *input, size_t len) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH256_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH256_update_endian(state_in, input, len, XXH_bigEndian);
}